

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_hash_map_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_5::FlatHashMap_MoveOnlyKey_Test::~FlatHashMap_MoveOnlyKey_Test
          (FlatHashMap_MoveOnlyKey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FlatHashMap, MoveOnlyKey) {
  struct Key {
    Key() = default;
    Key(Key&&) = default;
    Key& operator=(Key&&) = default;
  };
  struct Eq {
    bool operator()(const Key&, const Key&) const { return true; }
  };
  struct Hash {
    size_t operator()(const Key&) const { return 0; }
  };
  phmap::THIS_HASH_MAP<Key, int, Hash, Eq> m;
  m[Key()];
}